

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> *
OpenMD::operator*(double s,DynamicVector<double,_std::allocator<double>_> *v1)

{
  DynamicVector<double,_std::allocator<double>_> *in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  DynamicVector<double,_std::allocator<double>_> *in_XMM0_Qa;
  DynamicVector<double,_std::allocator<double>_> *result;
  size_type in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  DynamicVector<double,_std::allocator<double>_>::size
            ((DynamicVector<double,_std::allocator<double>_> *)0x261760);
  std::allocator<double>::allocator((allocator<double> *)0x261774);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_RDI,in_stack_ffffffffffffffa8,(allocator_type *)0x261788);
  std::allocator<double>::~allocator((allocator<double> *)0x261794);
  DynamicVector<double,_std::allocator<double>_>::mul
            (in_XMM0_Qa,in_RSI,(double)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  return in_RDI;
}

Assistant:

DynamicVector<Real> operator*(Real s, const DynamicVector<Real>& v1) {
    DynamicVector<Real> result(v1.size());
    result.mul(v1, s);
    return result;
  }